

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O2

connection_ptr __thiscall
websocketpp::endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
::get_con_from_hdl(endpoint<websocketpp::connection<websocketpp::config::asio>,_websocketpp::config::asio>
                   *this,connection_hdl *hdl,error_code *ec)

{
  error_category *peVar1;
  undefined4 *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  connection_ptr cVar3;
  __shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&_Stack_28,ec);
  std::static_pointer_cast<websocketpp::connection<websocketpp::config::asio>,void>
            ((shared_ptr<void> *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  _Var2._M_pi = extraout_RDX;
  if (*(long *)&(this->super_transport_type).super_socket_type.m_socket_init_handler.
                super__Function_base._M_functor == 0) {
    peVar1 = error::get_category();
    *in_RCX = 0xf;
    *(error_category **)(in_RCX + 2) = peVar1;
    _Var2._M_pi = extraout_RDX_00;
  }
  cVar3.
  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var2._M_pi;
  cVar3.
  super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (connection_ptr)
         cVar3.
         super___shared_ptr<websocketpp::connection<websocketpp::config::asio>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

connection_ptr get_con_from_hdl(connection_hdl hdl, lib::error_code & ec) {
        connection_ptr con = lib::static_pointer_cast<connection_type>(
            hdl.lock());
        if (!con) {
            ec = error::make_error_code(error::bad_connection);
        }
        return con;
    }